

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2lax_loop_shape.cc
# Opt level: O2

Edge * __thiscall
S2VertexIdLaxLoopShape::edge(Edge *__return_storage_ptr__,S2VertexIdLaxLoopShape *this,int e0)

{
  int iVar1;
  int *piVar2;
  S2Point *pSVar3;
  VType VVar4;
  int iVar5;
  S2LogMessage SStack_18;
  
  iVar1 = *(int *)&(this->super_S2Shape).field_0xc;
  if (e0 < iVar1) {
    iVar5 = 0;
    if (e0 + 1 != iVar1) {
      iVar5 = e0 + 1;
    }
    piVar2 = (this->vertex_ids_)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
             super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
             super__Head_base<0UL,_int_*,_false>._M_head_impl;
    pSVar3 = this->vertex_array_;
    iVar1 = piVar2[e0];
    iVar5 = piVar2[iVar5];
    (__return_storage_ptr__->v0).c_[2] = pSVar3[iVar1].c_[2];
    VVar4 = pSVar3[iVar1].c_[1];
    (__return_storage_ptr__->v0).c_[0] = pSVar3[iVar1].c_[0];
    (__return_storage_ptr__->v0).c_[1] = VVar4;
    VVar4 = pSVar3[iVar5].c_[1];
    (__return_storage_ptr__->v1).c_[0] = pSVar3[iVar5].c_[0];
    (__return_storage_ptr__->v1).c_[1] = VVar4;
    (__return_storage_ptr__->v1).c_[2] = pSVar3[iVar5].c_[2];
    return __return_storage_ptr__;
  }
  S2LogMessage::S2LogMessage
            (&SStack_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2lax_loop_shape.cc"
             ,0x57,kFatal,(ostream *)&std::cerr);
  std::operator<<(SStack_18.stream_,"Check failed: (e0) < (num_edges()) ");
  abort();
}

Assistant:

S2Shape::Edge S2VertexIdLaxLoopShape::edge(int e0) const {
  S2_DCHECK_LT(e0, num_edges());
  int e1 = e0 + 1;
  if (e1 == num_vertices()) e1 = 0;
  return Edge(vertex(e0), vertex(e1));
}